

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertDoublesWithin
               (UNITY_DOUBLE delta,UNITY_DOUBLE expected,UNITY_DOUBLE actual,char *msg,
               UNITY_UINT lineNumber)

{
  int iVar1;
  UNITY_UINT lineNumber_local;
  char *msg_local;
  UNITY_DOUBLE actual_local;
  UNITY_DOUBLE expected_local;
  UNITY_DOUBLE delta_local;
  
  if (((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) &&
     (iVar1 = UnityDoublesWithin(delta,expected,actual), iVar1 == 0)) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected ");
    UnityPrintFloat(expected);
    UnityPrint(" Was ");
    UnityPrintFloat(actual);
    UnityAddMsgIfSpecified(msg);
    Unity.CurrentTestFailed = 1;
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
  return;
}

Assistant:

void UnityAssertDoublesWithin(const UNITY_DOUBLE delta,
                              const UNITY_DOUBLE expected,
                              const UNITY_DOUBLE actual,
                              const char* msg,
                              const UNITY_LINE_TYPE lineNumber)
{
    RETURN_IF_FAIL_OR_IGNORE;

    if (!UnityDoublesWithin(delta, expected, actual))
    {
        UnityTestResultsFailBegin(lineNumber);
        UNITY_PRINT_EXPECTED_AND_ACTUAL_FLOAT(expected, actual);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}